

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O1

ItemSimilarityRecommender * __thiscall
CoreML::Specification::ItemSimilarityRecommender::New(ItemSimilarityRecommender *this,Arena *arena)

{
  ItemSimilarityRecommender *this_00;
  
  this_00 = (ItemSimilarityRecommender *)operator_new(0x70);
  ItemSimilarityRecommender(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ItemSimilarityRecommender>(arena,this_00);
  }
  return this_00;
}

Assistant:

ItemSimilarityRecommender* ItemSimilarityRecommender::New(::google::protobuf::Arena* arena) const {
  ItemSimilarityRecommender* n = new ItemSimilarityRecommender;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}